

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

ssize_t __thiscall Fl_Type::write(Fl_Type *this,int __fd,void *__buf,size_t __n)

{
  char *w;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ssize_t extraout_RAX;
  Fl_Type *pFVar2;
  
  write_indent(this->level);
  iVar1 = (*this->_vptr_Fl_Type[5])(this);
  write_word((char *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*this->_vptr_Fl_Type[0x26])(this);
  if (((iVar1 != 0) && (w = this[1].callback_, w != (char *)0x0)) && (*w != '\0')) {
    write_word(w);
  }
  write_word(this->name_);
  write_open(this->level);
  (*this->_vptr_Fl_Type[0xd])(this);
  write_close(this->level);
  iVar1 = (*this->_vptr_Fl_Type[0x16])(this);
  if (iVar1 != 0) {
    write_open(this->level);
    pFVar2 = this;
    while( true ) {
      pFVar2 = pFVar2->next;
      iVar1 = this->level;
      if ((pFVar2 == (Fl_Type *)0x0) || (pFVar2->level <= iVar1)) break;
      if (pFVar2->level == iVar1 + 1) {
        (*pFVar2->_vptr_Fl_Type[0xc])(pFVar2);
      }
    }
    write_close(iVar1);
    return extraout_RAX;
  }
  return CONCAT44(extraout_var_00,iVar1);
}

Assistant:

void Fl_Type::write() {
    write_indent(level);
    write_word(type_name());
    
    if (is_class()) {
      const char * p = 	((Fl_Class_Type*)this)->prefix();
      if (p &&	strlen(p))
        write_word(p);
    }

    write_word(name());
    write_open(level);
    write_properties();
    write_close(level);
    if (!is_parent()) return;
    // now do children:
    write_open(level);
    Fl_Type *child;
    for (child = next; child && child->level > level; child = child->next)
	if (child->level == level+1) child->write();
    write_close(level);
}